

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O3

uint32_t __thiscall Cache::getTag(Cache *this,uint32_t addr)

{
  bool bVar1;
  uint uVar2;
  char cVar3;
  char cVar4;
  ulong uVar5;
  char cVar6;
  
  uVar2 = (this->policy).blockSize;
  cVar6 = -1;
  cVar3 = -1;
  if (uVar2 != 0) {
    cVar4 = '\0';
    cVar3 = '\0';
    if (uVar2 != 1) {
      do {
        cVar3 = cVar4 + '\x01';
        bVar1 = 3 < uVar2;
        uVar2 = uVar2 >> 1;
        cVar4 = cVar3;
      } while (bVar1);
    }
  }
  uVar5 = (ulong)(this->policy).blockNum / (ulong)(this->policy).associativity;
  if ((int)uVar5 != 0) {
    cVar4 = '\0';
    cVar6 = '\0';
    if ((int)uVar5 != 1) {
      do {
        cVar6 = cVar4 + '\x01';
        uVar2 = (uint)uVar5;
        uVar5 = uVar5 >> 1;
        cVar4 = cVar6;
      } while (3 < uVar2);
    }
  }
  return addr >> (cVar6 + cVar3 & 0x1fU) & ~(-1 << (-(cVar6 + cVar3) & 0x1fU));
}

Assistant:

uint32_t Cache::getTag(uint32_t addr) {
  uint32_t offsetBits = log2i(policy.blockSize);
  uint32_t idBits = log2i(policy.blockNum / policy.associativity);
  uint32_t mask = (1 << (32 - offsetBits - idBits)) - 1;
  return (addr >> (offsetBits + idBits)) & mask;
}